

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O0

__string_type * __thiscall
qclab::qasm1_abi_cxx11_(__string_type *__return_storage_ptr__,qclab *this,char *type,int qubit)

{
  ostream *poVar1;
  stringstream local_1a8 [8];
  stringstream stream;
  ostream local_198 [380];
  int local_1c;
  qclab *pqStack_18;
  int qubit_local;
  char *type_local;
  
  local_1c = (int)type;
  pqStack_18 = this;
  type_local = (char *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,(char *)pqStack_18);
  poVar1 = std::operator<<(poVar1," q[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  std::operator<<(poVar1,"];\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm1( const char type[] , const int qubit ) {
    std::stringstream stream ;
    stream << type << " q[" << qubit << "];\n" ;
    return stream.str() ;
  }